

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strutil.cpp
# Opt level: O2

int test_strutil_trimcustom(ITesting *t)

{
  bool bVar1;
  kTRContinueMode kVar2;
  string *__str;
  int iVar3;
  allocator<char> local_49;
  string str;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"   \"dump\"  ",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28," \"\n",&local_49);
  __str = trun::trim(&str,&local_28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&str,__str);
  std::__cxx11::string::~string((string *)&local_28);
  bVar1 = std::operator==(&str,"dump");
  if (!bVar1) {
    kVar2 = (*t->AssertError)(0x3e,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                              ,"str == \"dump\"");
    if (kVar2 == kTRLeave) {
      iVar3 = 0x10;
      goto LAB_001849df;
    }
  }
  iVar3 = 0;
LAB_001849df:
  std::__cxx11::string::~string((string *)&str);
  return iVar3;
}

Assistant:

DLL_EXPORT int test_strutil_trimcustom(ITesting *t) {
    std::string str("   \"dump\"  ");
    str = trun::trim(str, " \"\n");
    TR_ASSERT(t,str == "dump");
    return kTR_Pass;
}